

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::StringConst::StringConst(StringConst *this,string *value,uint32_t width)

{
  initializer_list<const_kratos::IRNode_*> __l;
  int64_t value_00;
  long lVar1;
  VarException *this_00;
  remove_reference_t<unsigned_int_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  allocator<const_kratos::IRNode_*> local_119;
  StringConst *local_118;
  StringConst **local_110;
  size_type local_108;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_100;
  string local_d8;
  ulong local_b8;
  size_type min_size;
  string *psStack_a8;
  uint32_t width_local;
  string *value_local;
  StringConst *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs;
  string *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_10;
  
  min_size._4_4_ = width;
  psStack_a8 = value;
  value_local = (string *)this;
  value_00 = convert_string_to_int(value);
  Const::Const(&this->super_Const,value_00,min_size._4_4_,false);
  (this->super_Const).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005a4848;
  std::__cxx11::string::string((string *)&this->value_,(string *)value);
  lVar1 = std::__cxx11::string::size();
  local_b8 = lVar1 << 3;
  if (min_size._4_4_ < local_b8) {
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    local_38 = &local_d8;
    local_40 = "{0} is too big for constant with bit size {0}";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)((long)&min_size + 4);
    local_48 = value;
    fmt::v7::make_args_checked<std::__cxx11::string&,unsigned_int&,char[46],char>
              (&local_78,(v7 *)"{0} is too big for constant with bit size {0}",(char (*) [46])value,
               (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x2d,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_88.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_d8,(detail *)local_88.data_,format_str,args);
    local_110 = &local_118;
    local_108 = 1;
    local_118 = this;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_119);
    __l._M_len = local_108;
    __l._M_array = (iterator)local_110;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_100,__l,&local_119);
    VarException::VarException(this_00,&local_d8,&local_100);
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  return;
}

Assistant:

StringConst::StringConst(std::string value, uint32_t width)
    : Const(convert_string_to_int(value), width, false), value_(std::move(value)) {
    auto const min_size = value_.size() * 8u;
    if (min_size > width)
        throw VarException(::format("{0} is too big for constant with bit size {0}", value, width),
                           {this});
}